

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers_iforest.hpp
# Opt level: O1

void calc_kurt_all_cols<InputData<float,unsigned_long>&,WorkerMemory<ImputedData<unsigned_long,double>,double,float>&,double>
               (InputData<float,_unsigned_long> *input_data,
               WorkerMemory<ImputedData<unsigned_long,_double>,_double,_float> *workspace,
               ModelParams *model_params,double *kurtosis,double *saved_xmin,double *saved_xmax)

{
  Xoshiro256PP *rnd_generator;
  ColumnSampler<double> *this;
  vector<double,_std::allocator<double>_> *w;
  robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  *w_00;
  size_t sVar1;
  ulong col_num;
  pointer pdVar2;
  pointer pdVar3;
  size_t *psVar4;
  unsigned_long *Xc_indptr;
  size_t sVar5;
  long lVar6;
  double dVar7;
  
  this = &workspace->col_sampler;
  ColumnSampler<double>::prepare_full_pass(this);
  sVar1 = (workspace->col_sampler).curr_pos;
  sVar5 = (workspace->col_sampler).curr_col;
  if (sVar1 != 0 && sVar1 != sVar5) {
    w = &workspace->weights_arr;
    rnd_generator = &workspace->rnd_generator;
    w_00 = &workspace->weights_map;
    do {
      (workspace->col_sampler).last_given = sVar5;
      (workspace->col_sampler).curr_col = sVar5 + 1;
      workspace->col_chosen =
           (workspace->col_sampler).col_indices.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[sVar5];
      if (saved_xmin == (double *)0x0) {
LAB_002ee254:
        col_num = workspace->col_chosen;
        lVar6 = col_num - input_data->ncols_numeric;
        if (col_num < input_data->ncols_numeric) {
          Xc_indptr = input_data->Xc_indptr;
          psVar4 = (workspace->ix_arr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (Xc_indptr == (unsigned_long *)0x0) {
            pdVar2 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            pdVar3 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            if ((pdVar2 == pdVar3) && ((workspace->weights_map).m_ht.m_nb_elements == 0)) {
              dVar7 = calc_kurtosis<float,double>
                                (psVar4,workspace->st,workspace->end,
                                 input_data->numeric_data + col_num * input_data->nrows,
                                 model_params->missing_action);
            }
            else if (pdVar2 == pdVar3) {
              dVar7 = calc_kurtosis_weighted<float,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,double>
                                (psVar4,workspace->st,workspace->end,
                                 input_data->numeric_data + col_num * input_data->nrows,
                                 model_params->missing_action,w_00);
            }
            else {
              dVar7 = calc_kurtosis_weighted<float,std::vector<double,std::allocator<double>>,double>
                                (psVar4,workspace->st,workspace->end,
                                 input_data->numeric_data + col_num * input_data->nrows,
                                 model_params->missing_action,w);
            }
          }
          else {
            pdVar2 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            pdVar3 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            if ((pdVar2 == pdVar3) && ((workspace->weights_map).m_ht.m_nb_elements == 0)) {
              dVar7 = calc_kurtosis<float,unsigned_long,double>
                                (psVar4,workspace->st,workspace->end,col_num,input_data->Xc,
                                 input_data->Xc_ind,Xc_indptr,model_params->missing_action);
            }
            else if (pdVar2 == pdVar3) {
              dVar7 = calc_kurtosis_weighted<float,unsigned_long,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,double>
                                (psVar4,workspace->st,workspace->end,col_num,input_data->Xc,
                                 input_data->Xc_ind,Xc_indptr,model_params->missing_action,w_00);
            }
            else {
              dVar7 = calc_kurtosis_weighted<float,unsigned_long,std::vector<double,std::allocator<double>>,double>
                                (psVar4,workspace->st,workspace->end,col_num,input_data->Xc,
                                 input_data->Xc_ind,Xc_indptr,model_params->missing_action,w);
            }
          }
        }
        else {
          pdVar2 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pdVar3 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          psVar4 = (workspace->ix_arr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((pdVar2 == pdVar3) && ((workspace->weights_map).m_ht.m_nb_elements == 0)) {
            dVar7 = calc_kurtosis<double>
                              (psVar4,workspace->st,workspace->end,
                               input_data->categ_data + input_data->nrows * lVar6,
                               input_data->ncat[lVar6],
                               (workspace->buffer_szt).
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               (workspace->buffer_dbl).
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start,model_params->missing_action,
                               model_params->cat_split_type,rnd_generator);
          }
          else if (pdVar2 == pdVar3) {
            dVar7 = calc_kurtosis_weighted<tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,double>
                              (psVar4,workspace->st,workspace->end,
                               input_data->categ_data + input_data->nrows * lVar6,
                               input_data->ncat[lVar6],
                               (workspace->buffer_dbl).
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start,model_params->missing_action,
                               model_params->cat_split_type,rnd_generator,w_00);
          }
          else {
            dVar7 = calc_kurtosis_weighted<std::vector<double,std::allocator<double>>,double>
                              (psVar4,workspace->st,workspace->end,
                               input_data->categ_data + input_data->nrows * lVar6,
                               input_data->ncat[lVar6],
                               (workspace->buffer_dbl).
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start,model_params->missing_action,
                               model_params->cat_split_type,rnd_generator,w);
          }
        }
        sVar1 = workspace->col_chosen;
        kurtosis[sVar1] = dVar7;
        if (dVar7 <= -INFINITY) {
          ColumnSampler<double>::drop_col(this,sVar1,0xffffffffffffffff);
        }
        sVar1 = workspace->col_chosen;
        dVar7 = 0.0;
        if ((-INFINITY < kurtosis[sVar1]) && (dVar7 = kurtosis[sVar1] + -1.0, dVar7 <= 1e-08)) {
          dVar7 = 1e-08;
        }
        kurtosis[sVar1] = dVar7;
        if (0.0 < dVar7 && input_data->col_weights != (float *)0x0) {
          dVar7 = dVar7 * (double)input_data->col_weights[sVar1];
          if (dVar7 <= 1e-100) {
            dVar7 = 1e-100;
          }
          kurtosis[sVar1] = dVar7;
        }
      }
      else {
        get_split_range<InputData<float,unsigned_long>,WorkerMemory<ImputedData<unsigned_long,double>,double,float>>
                  (workspace,input_data,model_params);
        if (workspace->unsplittable != true) {
          sVar1 = workspace->col_chosen;
          saved_xmin[sVar1] = workspace->xmin;
          saved_xmax[sVar1] = workspace->xmax;
          goto LAB_002ee254;
        }
        ColumnSampler<double>::drop_col(this,workspace->col_chosen,0xffffffffffffffff);
      }
      sVar1 = (workspace->col_sampler).curr_pos;
    } while ((sVar1 != 0) && (sVar5 = (workspace->col_sampler).curr_col, sVar1 != sVar5));
  }
  return;
}

Assistant:

void calc_kurt_all_cols(InputData &input_data, WorkerMemory &workspace, ModelParams &model_params,
                        double *restrict kurtosis, double *restrict saved_xmin, double *restrict saved_xmax)
{
    workspace.col_sampler.prepare_full_pass();
    while (workspace.col_sampler.sample_col(workspace.col_chosen))
    {
        if (saved_xmin != NULL)
        {
            get_split_range(workspace, input_data, model_params);
            if (workspace.unsplittable)
            {
                workspace.col_sampler.drop_col(workspace.col_chosen);
                continue;
            }

            if (saved_xmin != NULL)
            {
                saved_xmin[workspace.col_chosen] = workspace.xmin;
                saved_xmax[workspace.col_chosen] = workspace.xmax;
            }
        }

        if (workspace.col_chosen < input_data.ncols_numeric)
        {
            if (input_data.Xc_indptr == NULL)
            {
                if (workspace.weights_arr.empty() && workspace.weights_map.empty())
                {
                    kurtosis[workspace.col_chosen] =
                        calc_kurtosis<typename std::remove_pointer<decltype(input_data.numeric_data)>::type,
                                      ldouble_safe>(
                                      workspace.ix_arr.data(), workspace.st, workspace.end,
                                      input_data.numeric_data + workspace.col_chosen * input_data.nrows,
                                      model_params.missing_action);
                }

                else if (!workspace.weights_arr.empty())
                {
                    kurtosis[workspace.col_chosen] =
                        calc_kurtosis_weighted<typename std::remove_pointer<decltype(input_data.numeric_data)>::type,
                                               decltype(workspace.weights_arr), ldouble_safe>(
                                               workspace.ix_arr.data(), workspace.st, workspace.end,
                                               input_data.numeric_data + workspace.col_chosen * input_data.nrows,
                                               model_params.missing_action, workspace.weights_arr);
                }

                else
                {
                    kurtosis[workspace.col_chosen] =
                        calc_kurtosis_weighted<typename std::remove_pointer<decltype(input_data.numeric_data)>::type,
                                               decltype(workspace.weights_map), ldouble_safe>(
                                               workspace.ix_arr.data(), workspace.st, workspace.end,
                                               input_data.numeric_data + workspace.col_chosen * input_data.nrows,
                                               model_params.missing_action, workspace.weights_map);
                }
            }

            else
            {
                if (workspace.weights_arr.empty() && workspace.weights_map.empty())
                {
                    kurtosis[workspace.col_chosen] =
                        calc_kurtosis<typename std::remove_pointer<decltype(input_data.Xc)>::type,
                                      typename std::remove_pointer<decltype(input_data.Xc_indptr)>::type,
                                      ldouble_safe>(
                                      workspace.ix_arr.data(), workspace.st, workspace.end,
                                      workspace.col_chosen,
                                      input_data.Xc, input_data.Xc_ind, input_data.Xc_indptr,
                                      model_params.missing_action);
                }

                else if (!workspace.weights_arr.empty())
                {
                    kurtosis[workspace.col_chosen] =
                        calc_kurtosis_weighted<typename std::remove_pointer<decltype(input_data.Xc)>::type,
                                               typename std::remove_pointer<decltype(input_data.Xc_indptr)>::type,
                                               decltype(workspace.weights_arr), ldouble_safe>(
                                               workspace.ix_arr.data(), workspace.st, workspace.end,
                                               workspace.col_chosen,
                                               input_data.Xc, input_data.Xc_ind, input_data.Xc_indptr,
                                               model_params.missing_action, workspace.weights_arr);
                }

                else
                {
                    kurtosis[workspace.col_chosen] =
                        calc_kurtosis_weighted<typename std::remove_pointer<decltype(input_data.Xc)>::type,
                                               typename std::remove_pointer<decltype(input_data.Xc_indptr)>::type,
                                               decltype(workspace.weights_map), ldouble_safe>(
                                               workspace.ix_arr.data(), workspace.st, workspace.end,
                                               workspace.col_chosen,
                                               input_data.Xc, input_data.Xc_ind, input_data.Xc_indptr,
                                               model_params.missing_action, workspace.weights_map);
                }
            }
        }

        else
        {
            size_t col = workspace.col_chosen - input_data.ncols_numeric;
            if (workspace.weights_arr.empty() && workspace.weights_map.empty())
            {
                kurtosis[workspace.col_chosen] =
                    calc_kurtosis<ldouble_safe>(
                                  workspace.ix_arr.data(), workspace.st, workspace.end,
                                  input_data.categ_data + col * input_data.nrows,
                                  input_data.ncat[col],
                                  workspace.buffer_szt.data(), workspace.buffer_dbl.data(),
                                  model_params.missing_action, model_params.cat_split_type,
                                  workspace.rnd_generator);
            }

            else if (!workspace.weights_arr.empty())
            {
                kurtosis[workspace.col_chosen] =
                    calc_kurtosis_weighted<decltype(workspace.weights_arr), ldouble_safe>(
                                           workspace.ix_arr.data(), workspace.st, workspace.end,
                                           input_data.categ_data + col * input_data.nrows,
                                           input_data.ncat[col],
                                           workspace.buffer_dbl.data(),
                                           model_params.missing_action, model_params.cat_split_type,
                                           workspace.rnd_generator, workspace.weights_arr);
            }

            else
            {
                kurtosis[workspace.col_chosen] =
                    calc_kurtosis_weighted<decltype(workspace.weights_map), ldouble_safe>(
                                           workspace.ix_arr.data(), workspace.st, workspace.end,
                                           input_data.categ_data + col * input_data.nrows,
                                           input_data.ncat[col],
                                           workspace.buffer_dbl.data(),
                                           model_params.missing_action, model_params.cat_split_type,
                                           workspace.rnd_generator, workspace.weights_map);
            }
        }

        if (kurtosis[workspace.col_chosen] == -HUGE_VAL)
            workspace.col_sampler.drop_col(workspace.col_chosen);

        kurtosis[workspace.col_chosen] = (kurtosis[workspace.col_chosen] == -HUGE_VAL)?
                                            0. : std::fmax(1e-8, -1. + kurtosis[workspace.col_chosen]);
        if (input_data.col_weights != NULL && kurtosis[workspace.col_chosen] > 0)
        {
            kurtosis[workspace.col_chosen] *= input_data.col_weights[workspace.col_chosen];
            kurtosis[workspace.col_chosen] = std::fmax(kurtosis[workspace.col_chosen], 1e-100);
        }
    }
}